

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOLinker::ScanDependencies
          (cmBinUtilsMacOSMachOLinker *this,string *file,TargetType type)

{
  bool bVar1;
  FileInfo *libs;
  string executableFile;
  string executablePath;
  string local_78;
  string local_58;
  string local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (type != EXECUTABLE) {
    cmRuntimeDependencyArchive::GetBundleExecutable_abi_cxx11_
              ((this->super_cmBinUtilsLinker).Archive);
  }
  std::__cxx11::string::_M_assign((string *)&local_78);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (local_78._M_string_length != 0) {
    cmsys::SystemTools::GetFilenamePath(&local_38,&local_78);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  libs = GetFileInfo(this,file);
  if (libs == (FileInfo *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = ScanDependencies(this,file,&libs->libs,&libs->rpaths,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return bVar1;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType type)
{
  std::string executableFile;
  if (type == cmStateEnums::EXECUTABLE) {
    executableFile = file;
  } else {
    executableFile = this->Archive->GetBundleExecutable();
  }
  std::string executablePath;
  if (!executableFile.empty()) {
    executablePath = cmSystemTools::GetFilenamePath(executableFile);
  }
  const FileInfo* file_info = this->GetFileInfo(file);
  if (file_info == nullptr) {
    return false;
  }
  return this->ScanDependencies(file, file_info->libs, file_info->rpaths,
                                executablePath);
}